

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall QGles2ComputePipeline::destroy(QGles2ComputePipeline *this)

{
  QRhiImplementation *pQVar1;
  long in_FS_OFFSET;
  DeferredReleaseEntry e;
  DeferredReleaseEntry local_34;
  QGles2ComputePipeline *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->program != 0) {
    local_34.field_1.renderbuffer.renderbuffer2 = 0xaaaaaaaa;
    local_34.field_1.renderbuffer.renderbuffer = this->program;
    local_34.type = Pipeline;
    this->program = 0;
    (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.s = 0;
    (this->samplers).super_QVLABase<QGles2SamplerDescription>.super_QVLABaseBase.s = 0;
    pQVar1 = (this->super_QRhiComputePipeline).super_QRhiResource.m_rhi;
    if (pQVar1 != (QRhiImplementation *)0x0) {
      QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::
      emplace<QRhiGles2::DeferredReleaseEntry_const&>
                ((QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)&pQVar1[2].implThread,
                 pQVar1[2].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.s
                 ,&local_34);
      QList<QRhiGles2::DeferredReleaseEntry>::end
                ((QList<QRhiGles2::DeferredReleaseEntry> *)&pQVar1[2].implThread);
      local_28 = this;
      QHash<QRhiResource*,bool>::removeImpl<QRhiResource*>
                ((QHash<QRhiResource*,bool> *)&pQVar1->resources,(QRhiResource **)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGles2ComputePipeline::destroy()
{
    if (!program)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Pipeline;

    e.pipeline.program = program;

    program = 0;
    uniforms.clear();
    samplers.clear();

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}